

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O3

X509 * find_issuer(X509_STORE_CTX *ctx,stack_st_X509 *sk,X509 *x)

{
  int iVar1;
  size_t sVar2;
  X509 *issuer;
  size_t sVar3;
  
  sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)sk);
  if (sVar2 != 0) {
    sVar2 = 0;
    do {
      issuer = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)sk,sVar2);
      iVar1 = x509_check_issued_with_callback(ctx,x,issuer);
      if (iVar1 != 0) {
        return issuer;
      }
      sVar2 = sVar2 + 1;
      sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)sk);
    } while (sVar2 < sVar3);
  }
  return (X509 *)0x0;
}

Assistant:

static X509 *find_issuer(X509_STORE_CTX *ctx, STACK_OF(X509) *sk, X509 *x) {
  size_t i;
  X509 *issuer;
  for (i = 0; i < sk_X509_num(sk); i++) {
    issuer = sk_X509_value(sk, i);
    if (x509_check_issued_with_callback(ctx, x, issuer)) {
      return issuer;
    }
  }
  return NULL;
}